

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

bool __thiscall
TTD::TTDIdentifierDictionary<unsigned_long,_Js::RecyclableObject_*>::Contains
          (TTDIdentifierDictionary<unsigned_long,_Js::RecyclableObject_*> *this,unsigned_long id)

{
  Entry *pEVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar6 = CONCAT44(0,this->m_h1Prime);
  if (((uVar6 != 0) && (uVar10 = (ulong)this->m_h2Prime, uVar10 != 0)) &&
     (pEVar1 = this->m_hashArray, pEVar1 != (Entry *)0x0)) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = id;
    bVar5 = 1;
    if (pEVar1[SUB168(auVar3 % auVar2,0)].Key != id) {
      if (pEVar1[SUB168(auVar3 % auVar2,0)].Key == 0) {
        bVar5 = 0;
      }
      else {
        uVar6 = id / uVar10;
        uVar7 = this->m_capacity - 1;
        uVar8 = (int)(id % uVar10) + SUB164(auVar3 % auVar2,0) & uVar7;
        uVar9 = uVar8;
        do {
          if (pEVar1[uVar9].Key == id) {
            uVar6 = 1;
            bVar4 = false;
          }
          else if (pEVar1[uVar9].Key == 0) {
            bVar4 = false;
            uVar6 = 0;
          }
          else {
            uVar9 = uVar9 + 1 & uVar7;
            bVar4 = true;
            if (uVar9 == uVar8) {
              TTDAbort_unrecoverable_error("The key is not here (or we messed up).");
            }
          }
          bVar5 = (byte)uVar6;
        } while (bVar4);
      }
    }
    return (bool)(bVar5 & 1);
  }
  TTDAbort_unrecoverable_error("Not valid!!");
}

Assistant:

bool Contains(Tag id) const
        {
            TTDAssert(this->m_h1Prime != 0 && this->m_h2Prime != 0, "Not valid!!");
            TTDAssert(this->m_hashArray != nullptr, "Not valid!!");

            //h1Prime is less than table size by construction so we dont need to re-index
            uint32 primaryIndex = TTD_DICTIONARY_HASH(id, this->m_h1Prime);
            if (this->m_hashArray[primaryIndex].Key == id)
            {
                return true;
            }

            if (this->m_hashArray[primaryIndex].Key == 0)
            {
                return false;
            }

            //do a hash for the second offset to avoid clustering and then do linear probing
            uint32 offset = TTD_DICTIONARY_HASH(id, this->m_h2Prime);
            uint32 probeIndex = TTD_DICTIONARY_INDEX(primaryIndex + offset, this->m_capacity);
            while (true)
            {
                Entry* curr = (this->m_hashArray + probeIndex);
                if (curr->Key == id)
                {
                    return true;
                }

                if (curr->Key == 0)
                {
                    return false;
                }

                probeIndex = TTD_DICTIONARY_INDEX(probeIndex + 1, this->m_capacity);

                TTDAssert(probeIndex != TTD_DICTIONARY_INDEX(primaryIndex + offset, this->m_capacity), "The key is not here (or we messed up).");
            }
        }